

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor_test.cpp
# Opt level: O2

void __thiscall SetOut::test_method(SetOut *this)

{
  undefined1 auVar1 [8];
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a8;
  char *local_88;
  char *local_80;
  string local_78 [32];
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"-e",&local_d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Huffman",&local_d2);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"Test message",&local_d3);
  Cryptor::cryptor_factory((string *)local_d0,(string *)local_c8,&local_a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_c8);
  auVar1 = local_d0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"Test out message",(allocator<char> *)local_c8);
  std::__cxx11::string::operator=((string *)((long)auVar1 + 0x28),local_38);
  std::__cxx11::string::~string(local_38);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_48,0x22);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_0010e998;
  local_b8._0_8_ = &boost::unit_test::lazy_ostream::inst;
  local_b8._8_8_ = (long)"Not possible mode: " + 0x13;
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_80 = "";
  std::__cxx11::string::string((string *)&local_a8,(string *)((long)local_d0 + 0x28));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[17]>
            (local_c8,&local_88,0x22,1,2,&local_a8,"cryptor->get_out_message()","Test out message",
             "\"Test out message\"");
  std::__cxx11::string::~string((string *)&local_a8);
  if (local_d0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_d0 + 8))();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SetOut) {

  auto cryptor = Cryptor::cryptor_factory(
    "-e",
    "Huffman",
    "Test message"
  );

  cryptor->set_out_message("Test out message");

  BOOST_CHECK_EQUAL(cryptor->get_out_message(), "Test out message");
}